

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O1

int Fra_ClauCheckBmc(Cla_Man_t *p,Vec_Int_t *vClause)

{
  int iVar1;
  int iVar2;
  
  iVar1 = sat_solver_solve(p->pSatBmc,vClause->pArray,vClause->pArray + vClause->nSize,0,0,0,0);
  iVar2 = 1;
  if (iVar1 != -1) {
    if (iVar1 != 1) {
      __assert_fail("RetValue == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClau.c"
                    ,0x183,"int Fra_ClauCheckBmc(Cla_Man_t *, Vec_Int_t *)");
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int Fra_ClauCheckBmc( Cla_Man_t * p, Vec_Int_t * vClause )
{
    int nBTLimit = 0;
    int RetValue;
    RetValue = sat_solver_solve( p->pSatBmc, Vec_IntArray(vClause), Vec_IntArray(vClause) + Vec_IntSize(vClause), 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( RetValue == l_False )
        return 1;
    assert( RetValue == l_True );
    return 0;
}